

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

void generate_non_global_ref
               (sexp_conflict ctx,sexp_conflict name,sexp_conflict cell,sexp_conflict lambda,
               sexp_conflict fv,int unboxp)

{
  sexp_conflict psVar1;
  int iVar2;
  sexp psVar3;
  sexp_uint_t val;
  
  psVar1 = (cell->value).type.cpl;
  if ((((ulong)lambda & 3) == 0 && psVar1 == lambda) && (lambda->tag == 0x1c)) {
    sexp_emit(ctx,'\x16');
    iVar2 = sexp_param_index(ctx,lambda,name);
    val = (sexp_uint_t)iVar2;
  }
  else {
    val = 0;
    while (((((ulong)fv & 3) == 0 && (fv->tag == 6)) &&
           ((psVar3 = (fv->value).type.name, (psVar3->value).type.name != name ||
            (psVar1 != (((psVar3->value).type.cpl)->value).type.cpl))))) {
      fv = (fv->value).type.cpl;
      val = val + 1;
    }
    sexp_emit(ctx,'\x18');
  }
  sexp_emit_word(ctx,val);
  if (unboxp != 0) {
    psVar3 = sexp_memq_op(ctx,(sexp)0x0,2,name,(psVar1->value).type.dl);
    if (psVar3 != (sexp)&DAT_0000003e) {
      sexp_emit(ctx,'7');
    }
  }
  sexp_inc_context_depth(ctx,1);
  return;
}

Assistant:

static void generate_non_global_ref (sexp ctx, sexp name, sexp cell,
                                     sexp lambda, sexp fv, int unboxp) {
  sexp_uint_t i;
  sexp loc = sexp_cdr(cell);
  if (loc == lambda && sexp_lambdap(lambda)) {
    /* local ref */
    sexp_emit(ctx, SEXP_OP_LOCAL_REF);
    sexp_emit_word(ctx, sexp_param_index(ctx, lambda, name));
  } else {
    /* closure ref */
    for (i=0; sexp_pairp(fv); fv=sexp_cdr(fv), i++)
      if ((name == sexp_ref_name(sexp_car(fv)))
          && (loc == sexp_ref_loc(sexp_car(fv))))
        break;
    sexp_emit(ctx, SEXP_OP_CLOSURE_REF);
    sexp_emit_word(ctx, i);
  }
  if (unboxp && (sexp_truep(sexp_memq(ctx, name, sexp_lambda_sv(loc)))))
    sexp_emit(ctx, SEXP_OP_CDR);
  sexp_inc_context_depth(ctx, +1);
}